

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O3

void __thiscall
compiler::CompilerAstWalker::visitWhileStatementAstNode
          (CompilerAstWalker *this,WhileStatementAstNode *node)

{
  element_type *peVar1;
  iterator __position;
  unsigned_long local_20;
  
  (*(this->super_AstWalker)._vptr_AstWalker[0x17])();
  (*(this->super_AstWalker)._vptr_AstWalker[3])
            (this,(node->expression).
                  super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  peVar1 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_20 = (long)(peVar1->byteCode).
                   super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(peVar1->byteCode).
                   super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 4;
  __position._M_current =
       (peVar1->loopConditionEvalJumpIndices).
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (peVar1->loopConditionEvalJumpIndices).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              (&peVar1->loopConditionEvalJumpIndices,__position,&local_20);
  }
  else {
    *__position._M_current = local_20;
    (peVar1->loopConditionEvalJumpIndices).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  emit(this,JumpIfFalse);
  (*(this->super_AstWalker)._vptr_AstWalker[2])
            (this,(node->statement).super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr);
  (*(this->super_AstWalker)._vptr_AstWalker[0x26])(this,node);
  return;
}

Assistant:

void visitWhileStatementAstNode(WhileStatementAstNode* node) noexcept override {
    this->onEnterWhileStatementAstNode(node);
    this->visitExpressionAstNode(node->expression.get());
    this->ec->loopConditionEvalJumpIndices.push_back(this->ec->byteCode.size());
    this->emit(bytecode::ByteCodeInstruction::JumpIfFalse);
    this->visitStatementAstNode(node->statement.get());
    this->onExitWhileStatementAstNode(node);
  }